

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::EqualTest<int,short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  bool bVar1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd4;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  undefined4 local_20;
  int local_18;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  int local_10;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_c;
  int local_8;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  
  local_8 = 3;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_4,&local_8);
  bVar1 = ::operator==(0x25,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0)
  ;
  uVar2 = false;
  if (bVar1) {
    local_10 = 4;
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_c,&local_10);
    bVar1 = ::operator==((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                         0x25);
    uVar2 = false;
    if (bVar1) {
      local_18 = 6;
      SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                (&local_14,&local_18);
      local_20 = 7;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffd4.m_int,
                          CONCAT13(in_stack_ffffffffffffffd3,
                                   CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))),
                 (int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
      rhs.m_int._1_1_ = in_stack_ffffffffffffffd3;
      rhs.m_int._0_1_ = in_stack_ffffffffffffffd2;
      bVar1 = ::operator==(in_stack_ffffffffffffffd4,rhs);
      uVar2 = false;
      if (bVar1) {
        local_28 = 1;
        SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                  (&local_24,&local_28);
        bVar1 = ::operator==((bool)in_stack_ffffffffffffffd3,in_stack_ffffffffffffffd4);
        uVar2 = false;
        if (bVar1) {
          bVar1 = false;
          SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                    ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
          uVar2 = ::operator==(bVar1,in_stack_ffffffffffffffd4);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}